

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsGroupOf_PDU.cpp
# Opt level: O3

KBOOL __thiscall KDIS::PDU::IsGroupOf_PDU::operator==(IsGroupOf_PDU *this,IsGroupOf_PDU *Value)

{
  pointer pKVar1;
  pointer pKVar2;
  KBOOL KVar3;
  pointer pKVar4;
  GED **ppGVar5;
  bool bVar6;
  
  KVar3 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if ((((!KVar3) &&
       (KVar3 = DATA_TYPE::EntityIdentifier::operator!=
                          (&this->m_GroupedEntityID,&Value->m_GroupedEntityID), !KVar3)) &&
      (this->m_ui8GrpdEntCat == Value->m_ui8GrpdEntCat)) &&
     (this->m_ui8NumOfGroupedEnts == Value->m_ui8NumOfGroupedEnts)) {
    if (((double)this->m_f64GrpLat == (double)Value->m_f64GrpLat) &&
       (!NAN((double)this->m_f64GrpLat) && !NAN((double)Value->m_f64GrpLat))) {
      if (((double)this->m_f64GrpLon == (double)Value->m_f64GrpLon) &&
         (!NAN((double)this->m_f64GrpLon) && !NAN((double)Value->m_f64GrpLon))) {
        pKVar1 = (this->m_vpGED).
                 super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pKVar2 = (this->m_vpGED).
                 super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pKVar4 = (Value->m_vpGED).
                 super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((long)pKVar2 - (long)pKVar1 ==
            (long)(Value->m_vpGED).
                  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pKVar4) {
          if (pKVar1 == pKVar2) {
            return true;
          }
          ppGVar5 = &pKVar4->m_pRef;
          do {
            pKVar4 = pKVar1 + 1;
            bVar6 = pKVar1->m_pRef == *ppGVar5;
            if (!bVar6) {
              return bVar6;
            }
            ppGVar5 = ppGVar5 + 3;
            pKVar1 = pKVar4;
          } while (pKVar4 != pKVar2);
          return bVar6;
        }
      }
    }
  }
  return false;
}

Assistant:

KBOOL IsGroupOf_PDU::operator == ( const IsGroupOf_PDU & Value ) const
{
    if( Header::operator      !=( Value ) )                    return false;
    if( m_GroupedEntityID     != Value.m_GroupedEntityID )     return false;
    if( m_ui8GrpdEntCat       != Value.m_ui8GrpdEntCat )       return false;
    if( m_ui8NumOfGroupedEnts != Value.m_ui8NumOfGroupedEnts ) return false;
    if( m_f64GrpLat           != Value.m_f64GrpLat )           return false;
    if( m_f64GrpLon           != Value.m_f64GrpLon )           return false;
    if( m_vpGED               != Value.m_vpGED )               return false;
    return true;
}